

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Own<kj::Filesystem,_std::nullptr_t> kj::newDiskFilesystem(void)

{
  bool bVar1;
  String *pSVar2;
  size_t sVar3;
  _func_int *p_Var4;
  __ino64_t _Var5;
  int iVar6;
  _func_int **pp_Var7;
  size_t sVar8;
  ulong *__buf;
  char *pcVar9;
  char *pcVar10;
  int *piVar11;
  size_t in_RCX;
  char *pcVar12;
  Filesystem *extraout_RDX;
  Filesystem *extraout_RDX_00;
  Filesystem *extraout_RDX_01;
  Filesystem *extraout_RDX_02;
  Filesystem *pFVar13;
  Path *this;
  ulong *puVar14;
  Exception *e;
  Disposer *in_RDI;
  undefined1 auVar15 [8];
  StringPtr path_00;
  StringPtr path_01;
  Own<kj::Filesystem,_std::nullptr_t> OVar16;
  DebugComparison<const_char_&,_char> _kjCondition;
  Fault f;
  char *pwd;
  stat pwdStat;
  stat dotStat;
  Array<char> buf_heap;
  char buf_stack [256];
  StringPtr path;
  Path local_6a8;
  _func_int **local_688;
  _func_int **local_680;
  undefined1 local_678 [8];
  _func_int *p_Stack_670;
  ArrayDisposer *pAStack_668;
  size_t local_660;
  bool local_658;
  PathPtr local_650;
  Path *local_640;
  Exception *local_638;
  Disposer *local_630;
  stat64 local_628;
  bool local_598;
  undefined7 uStack_597;
  __ino64_t local_590;
  stat64 local_508 [2];
  undefined1 local_368 [416];
  StringPtr local_1c8 [25];
  
  local_630 = in_RDI;
  pp_Var7 = (_func_int **)operator_new(0x40);
  *pp_Var7 = (_func_int *)&PTR_getRoot_00627b40;
  local_688 = pp_Var7;
  anon_unknown_9::DiskFilesystem::openDir((DiskFilesystem *)local_368,"/");
  *(undefined4 *)(pp_Var7 + 2) = local_368._0_4_;
  local_368._0_4_ = -1;
  pp_Var7[1] = (_func_int *)&PTR_getFd_006276b8;
  OwnFd::~OwnFd((OwnFd *)local_368);
  local_680 = pp_Var7 + 2;
  anon_unknown_9::DiskFilesystem::openDir((DiskFilesystem *)local_368,".");
  *(undefined4 *)(pp_Var7 + 4) = local_368._0_4_;
  local_368._0_4_ = 0xffffffff;
  pp_Var7[3] = (_func_int *)&PTR_getFd_006276b8;
  OwnFd::~OwnFd((OwnFd *)local_368);
  local_640 = (Path *)(pp_Var7 + 5);
  local_638 = (Exception *)getenv("PWD");
  if (local_638 != (Exception *)0x0) {
    local_6a8.parts.ptr = (String *)0x0;
    local_6a8.parts.size_ = 0;
    local_6a8.parts.disposer = (ArrayDisposer *)0x0;
    local_658 = *(code *)&(local_638->ownFile).content.ptr == (code)0x2f;
    p_Stack_670 = (_func_int *)CONCAT71(p_Stack_670._1_7_,0x2f);
    pAStack_668 = (ArrayDisposer *)0x48a289;
    local_660 = 5;
    local_678 = (undefined1  [8])local_638;
    if (local_658) {
      this = (Path *)((long)&(local_638->ownFile).content.ptr + 1);
      sVar8 = strlen((char *)this);
      path_00.content.size_ = in_RCX;
      path_00.content.ptr = (char *)(sVar8 + 1);
      Path::parse((Path *)local_678,this,path_00);
      sVar3 = local_6a8.parts.size_;
      pSVar2 = local_6a8.parts.ptr;
      if ((Exception *)local_6a8.parts.ptr != (Exception *)0x0) {
        local_6a8.parts.ptr = (String *)0x0;
        local_6a8.parts.size_ = 0;
        (**(local_6a8.parts.disposer)->_vptr_ArrayDisposer)
                  (local_6a8.parts.disposer,pSVar2,0x18,sVar3,sVar3,
                   ArrayDisposer::Dispose_<kj::String>::destruct);
      }
      local_6a8.parts.ptr = (String *)local_678;
      local_6a8.parts.size_ = (size_t)p_Stack_670;
      local_6a8.parts.disposer = pAStack_668;
      do {
        local_650.parts.ptr = local_6a8.parts.ptr;
        local_650.parts.size_ = local_6a8.parts.size_;
        PathPtr::toString((String *)local_678,&local_650,true);
        auVar15 = (undefined1  [8])(Exception *)0x4b4903;
        if (p_Stack_670 != (_func_int *)0x0) {
          auVar15 = local_678;
        }
        iVar6 = lstat64((char *)auVar15,&local_628);
        p_Var4 = p_Stack_670;
        auVar15 = local_678;
        if (local_678 != (undefined1  [8])0x0) {
          local_678 = (undefined1  [8])0x0;
          p_Stack_670 = (_func_int *)0x0;
          (**pAStack_668->_vptr_ArrayDisposer)(pAStack_668,auVar15,1,p_Var4,p_Var4,0);
        }
        if (-1 < iVar6) goto LAB_0046bf98;
        iVar6 = _::Debug::getOsErrorNumber(false);
      } while (iVar6 == -1);
      if (iVar6 == 0) {
LAB_0046bf98:
        do {
          iVar6 = lstat64(".",(stat64 *)&local_598);
          if (-1 < iVar6) goto LAB_0046c086;
          iVar6 = _::Debug::getOsErrorNumber(false);
        } while (iVar6 == -1);
        if (iVar6 != 0) {
          local_650.parts.ptr = (String *)0x0;
          local_678 = (undefined1  [8])0x0;
          p_Stack_670 = (_func_int *)0x0;
          _::Debug::Fault::init
                    ((Fault *)&local_650,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                    );
          _::Debug::Fault::~Fault((Fault *)&local_650);
        }
      }
      else {
        _::Debug::Fault::Fault<int,kj::Path&>
                  ((Fault *)local_678,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x6a0,iVar6,"lstat(result.toString(true).cStr(), &pwdStat)","result",&local_6a8)
        ;
        _::Debug::Fault::~Fault((Fault *)local_678);
      }
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char_const&,char>&>
                ((Fault *)&local_650,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x69e,FAILED,"pwd[0] == \'/\'","_kjCondition,",
                 (DebugComparison<const_char_&,_char> *)local_678);
      _::Debug::Fault::~Fault((Fault *)&local_650);
    }
LAB_0046c086:
    local_368._0_4_ = local_368._0_4_ & 0xffffff00;
    if ((local_628.st_ino == local_590) && (local_628.st_dev == CONCAT71(uStack_597,local_598))) {
      pp_Var7[5] = (_func_int *)local_6a8.parts.ptr;
      pp_Var7[6] = (_func_int *)local_6a8.parts.size_;
      pp_Var7[7] = (_func_int *)local_6a8.parts.disposer;
      goto LAB_0046c2ac;
    }
    if (_::Debug::minSeverity < 1) {
      _::Debug::log<char_const(&)[57],char_const*&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x6b1,INFO,"\"PWD environment variable doesn\'t match current directory\", pwd",
                 (char (*) [57])"PWD environment variable doesn\'t match current directory",
                 (char **)&local_638);
    }
    if (local_368[0] == '\x01') {
      Exception::~Exception((Exception *)(local_368 + 8));
    }
    sVar3 = local_6a8.parts.size_;
    pSVar2 = local_6a8.parts.ptr;
    if ((Exception *)local_6a8.parts.ptr != (Exception *)0x0) {
      local_6a8.parts.ptr = (String *)0x0;
      local_6a8.parts.size_ = 0;
      (**(local_6a8.parts.disposer)->_vptr_ArrayDisposer)
                (local_6a8.parts.disposer,pSVar2,0x18,sVar3,sVar3,
                 ArrayDisposer::Dispose_<kj::String>::destruct);
    }
  }
  pp_Var7 = (_func_int **)0x100;
  do {
    if (pp_Var7 < (_func_int **)0x101) {
      local_508[0].st_dev = 0;
      local_508[0].st_ino = 0;
      local_508[0].st_nlink = 0;
      __buf = (ulong *)local_368;
    }
    else {
      __buf = (ulong *)_::HeapArrayDisposer::allocateImpl
                                 (1,(size_t)pp_Var7,(size_t)pp_Var7,(_func_void_void_ptr *)0x0,
                                  (_func_void_void_ptr *)0x0);
      local_508[0].st_nlink = (__nlink_t)&_::HeapArrayDisposer::instance;
      local_508[0].st_dev = (__dev_t)__buf;
      local_508[0].st_ino = (__ino64_t)pp_Var7;
    }
    puVar14 = (ulong *)local_508[0].st_dev;
    pcVar9 = getcwd((char *)__buf,(size_t)pp_Var7);
    if (pcVar9 == (char *)0x0) {
      piVar11 = __errno_location();
      if (*piVar11 != 0x22) {
        local_628.st_dev = 0;
        local_1c8[0].content.ptr = (char *)0x0;
        local_1c8[0].content.size_ = 0;
        _::Debug::Fault::init
                  ((Fault *)&local_628,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                  );
        _::Debug::Fault::fatal((Fault *)&local_628);
      }
      pp_Var7 = (_func_int **)((long)pp_Var7 * 2);
    }
    else {
      pcVar10 = (char *)strlen((char *)__buf);
      pcVar12 = pcVar10 + 1;
      local_1c8[0].content.ptr = (char *)__buf;
      local_1c8[0].content.size_ = (size_t)pcVar12;
      if (pcVar10 < (char *)0xd) {
        if (pcVar10 == (char *)0x0) {
          local_598 = false;
          goto LAB_0046c472;
        }
      }
      else {
        pcVar12 = (char *)(*__buf ^ 0x68636165726e7528);
        bVar1 = *(long *)((long)__buf + 5) == 0x29656c6261686361;
        local_598 = !bVar1 || pcVar12 != (char *)0x0;
        if (bVar1 && pcVar12 == (char *)0x0) {
          _::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[45],kj::StringPtr&>
                    ((Fault *)&local_628,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x6c8,FAILED,"!path.startsWith(\"(unreachable)\")",
                     "_kjCondition,\"working directory is not reachable from root\", path",
                     (DebugExpression<bool> *)&local_598,
                     (char (*) [45])"working directory is not reachable from root",local_1c8);
          _::Debug::Fault::fatal((Fault *)&local_628);
        }
      }
      local_598 = (char)*__buf == '/';
      if (!local_598) {
LAB_0046c472:
        _::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[34],kj::StringPtr&>
                  ((Fault *)&local_628,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x6c9,FAILED,"path.startsWith(\"/\")",
                   "_kjCondition,\"current directory is not absolute\", path",
                   (DebugExpression<bool> *)&local_598,
                   (char (*) [34])"current directory is not absolute",local_1c8);
        _::Debug::Fault::fatal((Fault *)&local_628);
      }
      path_01.content.size_ = (size_t)pcVar12;
      path_01.content.ptr = pcVar10;
      Path::parse(local_640,(Path *)((long)__buf + 1),path_01);
      puVar14 = (ulong *)local_508[0].st_dev;
    }
    _Var5 = local_508[0].st_ino;
    if (puVar14 != (ulong *)0x0) {
      local_508[0].st_dev = 0;
      local_508[0].st_ino = 0;
      (*(code *)**(undefined8 **)local_508[0].st_nlink)
                (local_508[0].st_nlink,puVar14,1,_Var5,_Var5,0);
    }
  } while (pcVar9 == (char *)0x0);
LAB_0046c2ac:
  pp_Var7 = local_688;
  do {
    iVar6 = stat64("/dev/..",(stat64 *)local_368);
    if (-1 < iVar6) goto LAB_0046c2e3;
    iVar6 = _::Debug::getOsErrorNumber(false);
  } while (iVar6 == -1);
  pFVar13 = extraout_RDX;
  if (iVar6 == 0) {
LAB_0046c2e3:
    do {
      iVar6 = fstat64(*(int *)local_680,local_508);
      pFVar13 = extraout_RDX_00;
      if (-1 < iVar6) goto LAB_0046c30f;
      iVar6 = _::Debug::getOsErrorNumber(false);
    } while (iVar6 == -1);
    pFVar13 = extraout_RDX_01;
    if (iVar6 != 0) {
      local_628.st_dev = 0;
      local_1c8[0].content.ptr = (char *)0x0;
      local_1c8[0].content.size_ = 0;
      _::Debug::Fault::init
                ((Fault *)&local_628,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      _::Debug::Fault::fatal((Fault *)&local_628);
    }
LAB_0046c30f:
    if (local_368._8_8_ != local_508[0].st_ino) {
      if (_::Debug::minSeverity < 2) {
        _::Debug::log<char_const(&)[75]>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x677,WARNING,
                   "\"root dir file descriptor is broken, probably because of qemu; compensating\"",
                   (char (*) [75])
                   "root dir file descriptor is broken, probably because of qemu; compensating");
      }
      anon_unknown_9::DiskFilesystem::openDir((DiskFilesystem *)&local_628,"/dev/..");
      local_1c8[0].content.ptr = (char *)CONCAT44(local_1c8[0].content.ptr._4_4_,*(int *)local_680);
      *(int *)local_680 = (int)local_628.st_dev;
      local_628.st_dev = CONCAT44(local_628.st_dev._4_4_,0xffffffff);
      OwnFd::~OwnFd((OwnFd *)local_1c8);
      OwnFd::~OwnFd((OwnFd *)&local_628);
      pFVar13 = extraout_RDX_02;
    }
  }
  local_630->_vptr_Disposer =
       (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::DiskFilesystem>::instance;
  local_630[1]._vptr_Disposer = pp_Var7;
  OVar16.ptr = pFVar13;
  OVar16.disposer = local_630;
  return OVar16;
}

Assistant:

Own<Filesystem> newDiskFilesystem() {
  return heap<DiskFilesystem>();
}